

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O3

void __thiscall
amrex::MLCellLinOp::BndryCondLoc::setLOBndryConds
          (BndryCondLoc *this,Geometry *geom,Real *dx,
          Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
          *lobc,Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *hibc,int ratio,RealVect *interior_bloc,Array<Real,_3> *domain_bloc_lo,
          Array<Real,_3> *domain_bloc_hi)

{
  size_type a_capacity;
  pointer pVVar1;
  pointer pVVar2;
  int *piVar3;
  BCTL *pBVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  PinnedVector<GpuArray<BCTL,_2_*_3>_> hv;
  MFIter mfi;
  GpuArray<amrex::MLCellLinOp::BCTL,_6U> tmp;
  
  MFIter::MFIter(&mfi,&(this->bcloc).super_FabArrayBase,'\0');
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      BATransformer::operator()
                ((Box *)&tmp,&((mfi.fabArray)->boxarray).m_bat,
                 (Box *)((long)((mfi.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[mfi.currentIndex] * 0x1c +
                        *(long *)&((((mfi.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      if (0 < this->m_ncomp) {
        lVar8 = 0;
        lVar5 = 0;
        lVar6 = 0;
        lVar7 = 0;
        do {
          piVar3 = &mfi.currentIndex;
          if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar3 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start + mfi.currentIndex;
          }
          hv.m_size._0_1_ = (geom->super_CoordSys).field_0x53;
          hv.m_data = (pointer)((ulong)(byte)(geom->super_CoordSys).field_0x52 << 0x20 |
                               (ulong)(byte)(geom->super_CoordSys).field_0x51);
          hv.m_size._1_3_ = 0;
          MLMGBndry::setBoxBC((RealTuple *)
                              (*(long *)&(this->bcloc).m_data.
                                         super_vector<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>_>
                                         .
                                         super__Vector_base<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[*piVar3].
                                         super_vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>
                                         .
                                         super__Vector_base<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>
                              + lVar6),(BCTuple *)
                                       (*(long *)&(this->bcond).m_data.
                                                  super_vector<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[*piVar3]
                                                  .
                                                  super_vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
                                                  .
                                                  super__Vector_base<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
                                       + lVar5),(Box *)&tmp,&geom->domain,
                              (Array<LinOpBCType,_3> *)
                              ((long)((lobc->
                                      super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                      ).
                                      super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8),
                              (Array<LinOpBCType,_3> *)
                              ((long)((hibc->
                                      super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                      ).
                                      super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8),
                              dx,ratio,interior_bloc,domain_bloc_lo,domain_bloc_hi,
                              (GpuArray<int,_3U> *)&hv);
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 0x30;
          lVar5 = lVar5 + 0x18;
          lVar8 = lVar8 + 0xc;
        } while (lVar7 < this->m_ncomp);
      }
      MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  hv.m_data = (pointer)0x0;
  hv.m_size = 0;
  hv.m_capacity = 0;
  a_capacity = (this->bctl_dv).m_size;
  if (a_capacity != 0) {
    PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
    ::AllocateBuffer(&hv,a_capacity);
  }
  MFIter::MFIter(&mfi,&(this->bctl).super_FabArrayBase,'\0');
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      if (0 < this->m_ncomp) {
        lVar6 = 0;
        lVar5 = 0;
        do {
          pBVar4 = tmp.arr + 3;
          lVar7 = 0;
          do {
            auVar9._8_4_ = (int)lVar7;
            auVar9._0_8_ = lVar7;
            auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
            auVar10 = (auVar9 | _DAT_0065b9a0) ^ _DAT_0065b9b0;
            if (auVar10._4_4_ == -0x80000000 && auVar10._0_4_ < -0x7ffffffa) {
              ((GpuArray<amrex::MLCellLinOp::BCTL,_6U> *)(pBVar4 + -3))->arr[0].type.bctype = -1;
              pBVar4[-2].type.bctype = -1;
            }
            auVar9 = (auVar9 | _DAT_0065f0d0) ^ _DAT_0065b9b0;
            if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7ffffffa) {
              pBVar4[-1].type.bctype = -1;
              (pBVar4->type).bctype = -1;
            }
            lVar7 = lVar7 + 4;
            pBVar4 = pBVar4 + 4;
          } while (lVar7 != 8);
          pVVar1 = (this->bcond).m_data.
                   super_vector<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pVVar2 = (this->bcloc).m_data.
                   super_vector<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = 1;
          lVar7 = lVar6;
          do {
            piVar3 = &mfi.currentIndex;
            if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar3 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start + mfi.currentIndex;
            }
            *(undefined4 *)((long)tmp.arr + lVar8 * 8 + -8) =
                 *(undefined4 *)
                  (*(long *)&pVVar1[*piVar3].
                             super_vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
                             .
                             super__Vector_base<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
                  + lVar7);
            piVar3 = &mfi.currentIndex;
            if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar3 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start + mfi.currentIndex;
            }
            *(undefined8 *)(&tmp.arr[0].type + lVar8 * 2) =
                 *(undefined8 *)
                  (*(long *)&pVVar2[*piVar3].
                             super_vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>
                             .
                             super__Vector_base<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>
                  + lVar7 * 2);
            lVar7 = lVar7 + 4;
            lVar8 = lVar8 + 2;
          } while (lVar8 != 0xd);
          PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
          ::push_back(&hv,&tmp);
          lVar5 = lVar5 + 1;
          lVar6 = lVar6 + 0x18;
        } while (lVar5 < this->m_ncomp);
      }
      MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  if (hv.m_size != 0) {
    memcpy((this->bctl_dv).m_data,hv.m_data,hv.m_size * 0x60);
  }
  Gpu::Device::streamSynchronize();
  if (hv.m_data != (pointer)0x0) {
    operator_delete(hv.m_data,hv.m_capacity * 0x60);
  }
  return;
}

Assistant:

void
MLCellLinOp::BndryCondLoc::setLOBndryConds (const Geometry& geom, const Real* dx,
                                            const Vector<Array<BCType,AMREX_SPACEDIM> >& lobc,
                                            const Vector<Array<BCType,AMREX_SPACEDIM> >& hibc,
                                            int ratio, const RealVect& interior_bloc,
                                            const Array<Real,AMREX_SPACEDIM>& domain_bloc_lo,
                                            const Array<Real,AMREX_SPACEDIM>& domain_bloc_hi)
{
    const Box& domain = geom.Domain();

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter mfi(bcloc); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.validbox();
        for (int icomp = 0; icomp < m_ncomp; ++icomp) {
            RealTuple & bloc  = bcloc[mfi][icomp];
            BCTuple   & bctag = bcond[mfi][icomp];
            MLMGBndry::setBoxBC(bloc, bctag, bx, domain, lobc[icomp], hibc[icomp],
                                dx, ratio, interior_bloc, domain_bloc_lo, domain_bloc_hi,
                                geom.isPeriodicArray());
        }
    }

    Gpu::PinnedVector<GpuArray<BCTL,2*AMREX_SPACEDIM> > hv;
    hv.reserve(bctl_dv.size());
    for (MFIter mfi(bctl); mfi.isValid(); ++mfi)
    {
        for (int icomp = 0; icomp < m_ncomp; ++icomp) {
            GpuArray<BCTL,2*AMREX_SPACEDIM> tmp;
            for (int m = 0; m < 2*AMREX_SPACEDIM; ++m) {
                tmp[m].type = bcond[mfi][icomp][m];
                tmp[m].location = bcloc[mfi][icomp][m];
            }
            hv.push_back(std::move(tmp));
        }
    }
    Gpu::copyAsync(Gpu::hostToDevice, hv.begin(), hv.end(), bctl_dv.begin());
    Gpu::streamSynchronize();
}